

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmu_helper.c
# Opt level: O1

void helper_booke206_tlbsx_ppc64(CPUPPCState_conflict2 *env,target_ulong address)

{
  ulong uVar1;
  uint uVar2;
  int iVar3;
  char cVar4;
  long lVar5;
  uint uVar6;
  uint uVar7;
  target_ulong *ptVar8;
  uintptr_t tlbml;
  ppcmas_tlb_t *tlb;
  long lVar9;
  uint uVar10;
  hwaddr raddr;
  uint local_68;
  uint local_58;
  uint local_40;
  hwaddr local_38;
  
  uVar1 = env->spr[0x276];
  lVar9 = 0;
  do {
    uVar6 = (uint)env->spr[lVar9 + 0x2b0];
    if (0xffffff < uVar6) {
      uVar7 = uVar6 & 0xfff;
      if (uVar7 == 0) {
        cVar4 = '\0';
      }
      else {
        iVar3 = 0;
        if (uVar7 != 0) {
          for (; (uVar7 >> iVar3 & 1) == 0; iVar3 = iVar3 + 1) {
          }
        }
        cVar4 = (char)iVar3;
      }
      uVar6 = uVar6 >> 0x18;
      iVar3 = 0;
      if (uVar6 != 0) {
        for (; (uVar6 >> iVar3 & 1) == 0; iVar3 = iVar3 + 1) {
        }
      }
      local_58 = (uint)(address >> 0xc);
      local_40 = (~(-1 << (cVar4 - (byte)iVar3 & 0x1f)) & local_58) << ((byte)iVar3 & 0x3f);
      uVar10 = 0;
      do {
        uVar2 = uVar10 & uVar6 + 0x7fffffff | local_40;
        if ((int)uVar2 < (int)uVar7) {
          if (lVar9 != 0) {
            lVar5 = 0;
            do {
              uVar2 = uVar2 + ((uint)env->spr[lVar5 + 0x2b0] & 0xfff);
              lVar5 = lVar5 + 1;
            } while (lVar9 != lVar5);
          }
          tlb = (ppcmas_tlb_t *)((env->tlb).tlb6 + (int)uVar2);
        }
        else {
          tlb = (ppcmas_tlb_t *)0x0;
        }
        if ((tlb != (ppcmas_tlb_t *)0x0) &&
           (iVar3 = ppcmas_tlb_check(env,tlb,&local_38,address,(uint)(uVar1 >> 0x10) & 0x3fff),
           iVar3 == 0)) {
          uVar2 = tlb->mas1;
          local_68 = (uint)uVar1;
          if (((uVar2 >> 0xc ^ local_68) & 1) == 0) {
            ptVar8 = env->spr + 0x2b0;
            lVar9 = 0;
            iVar3 = 0;
            goto LAB_00b6b68e;
          }
        }
        uVar10 = uVar10 + 1;
      } while (uVar10 != uVar6 + (uVar6 == 0));
    }
    lVar9 = lVar9 + 1;
    if (lVar9 == 4) {
      uVar6 = (uint)env->spr[0x274];
      env->spr[0x270] = (ulong)(uVar6 & 0x30000000);
      env->spr[0x271] = (ulong)(uVar6 & 0xf80);
      env->spr[0x272] = (ulong)(uVar6 & 0x1f);
      env->spr[0x273] = 0;
      env->spr[0x3b0] = 0;
      if ((uVar1 & 1) != 0) {
        env->spr[0x271] = (ulong)(uVar6 & 0xf80) | 0x1000;
      }
      env->spr[0x271] = env->spr[0x271] | uVar1 & 0xffffffffffff0000;
      iVar3 = env->last_way;
      uVar7 = *(byte *)((long)env->spr + 0x1583) - 1 & iVar3 + 1U;
      env->last_way = uVar7;
      env->spr[0x270] = (long)(int)uVar7 | (ulong)(uVar6 & 0x30000000) | (long)(iVar3 << 0x10);
      return;
    }
  } while( true );
LAB_00b6b68e:
  iVar3 = ((uint)*ptVar8 & 0xfff) + iVar3;
  uVar6 = (uint)((ulong)((long)tlb - (long)(env->tlb).tlb6) / 0x18);
  if ((int)uVar6 < iVar3) {
    lVar5 = 0;
    iVar3 = 0;
    do {
      iVar3 = ((uint)env->spr[lVar5 + 0x2b0] & 0xfff) + iVar3;
      if ((int)uVar6 < iVar3) {
        env->spr[0x270] =
             (long)(int)((uint)lVar9 |
                         (*(byte *)((long)env->spr + lVar5 * 8 + 0x1583) - 1 & uVar6) << 0x10 |
                        env->last_way);
        env->spr[0x271] = (ulong)uVar2;
        env->spr[0x272] = tlb->mas2;
        env->spr[0x273] = tlb->mas7_3;
        env->spr[0x3b0] = (ulong)*(uint *)((long)&tlb->mas7_3 + 4);
        return;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 != 4);
LAB_00b6b6dc:
    cpu_abort_ppc64((CPUState *)&env[-1].spr_cb[0x1bf].oea_write,"Unknown TLBe: %d\n");
  }
  lVar9 = lVar9 + 0x10000000;
  ptVar8 = ptVar8 + 1;
  if (lVar9 == 0x40000000) goto LAB_00b6b6dc;
  goto LAB_00b6b68e;
}

Assistant:

void helper_booke206_tlbsx(CPUPPCState *env, target_ulong address)
{
    ppcmas_tlb_t *tlb = NULL;
    int i, j;
    hwaddr raddr;
    uint32_t spid, sas;

    spid = (env->spr[SPR_BOOKE_MAS6] & MAS6_SPID_MASK) >> MAS6_SPID_SHIFT;
    sas = env->spr[SPR_BOOKE_MAS6] & MAS6_SAS;

    for (i = 0; i < BOOKE206_MAX_TLBN; i++) {
        int ways = booke206_tlb_ways(env, i);

        for (j = 0; j < ways; j++) {
            tlb = booke206_get_tlbm(env, i, address, j);

            if (!tlb) {
                continue;
            }

            if (ppcmas_tlb_check(env, tlb, &raddr, address, spid)) {
                continue;
            }

            if (sas != ((tlb->mas1 & MAS1_TS) >> MAS1_TS_SHIFT)) {
                continue;
            }

            booke206_tlb_to_mas(env, tlb);
            return;
        }
    }

    /* no entry found, fill with defaults */
    env->spr[SPR_BOOKE_MAS0] = env->spr[SPR_BOOKE_MAS4] & MAS4_TLBSELD_MASK;
    env->spr[SPR_BOOKE_MAS1] = env->spr[SPR_BOOKE_MAS4] & MAS4_TSIZED_MASK;
    env->spr[SPR_BOOKE_MAS2] = env->spr[SPR_BOOKE_MAS4] & MAS4_WIMGED_MASK;
    env->spr[SPR_BOOKE_MAS3] = 0;
    env->spr[SPR_BOOKE_MAS7] = 0;

    if (env->spr[SPR_BOOKE_MAS6] & MAS6_SAS) {
        env->spr[SPR_BOOKE_MAS1] |= MAS1_TS;
    }

    env->spr[SPR_BOOKE_MAS1] |= (env->spr[SPR_BOOKE_MAS6] >> 16)
        << MAS1_TID_SHIFT;

    /* next victim logic */
    env->spr[SPR_BOOKE_MAS0] |= env->last_way << MAS0_ESEL_SHIFT;
    env->last_way++;
    env->last_way &= booke206_tlb_ways(env, 0) - 1;
    env->spr[SPR_BOOKE_MAS0] |= env->last_way << MAS0_NV_SHIFT;
}